

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveAlign::Encode(CDirectiveAlign *this)

{
  bool bVar1;
  uint uVar2;
  u64 uVar3;
  size_t in_RCX;
  uint uVar4;
  uint uVar5;
  uchar AlignBuffer [128];
  undefined1 auStack_a8 [136];
  
  uVar3 = FileManager::getVirtualAddress(g_fileManager);
  uVar4 = (uint)(uVar3 % (ulong)(long)this->alignment);
  uVar5 = this->alignment - uVar4;
  if (uVar4 != 0) {
    uVar4 = uVar5;
  }
  uVar2 = 0x80;
  if ((int)uVar4 < 0x80) {
    uVar2 = uVar4;
  }
  memset(auStack_a8,0,(long)(int)uVar2);
  if (0x80 < (int)uVar4) {
    do {
      FileManager::write(g_fileManager,(int)auStack_a8,(void *)0x80,in_RCX);
      uVar4 = uVar5 - 0x80;
      bVar1 = 0x100 < uVar5;
      uVar5 = uVar4;
    } while (bVar1);
  }
  FileManager::write(g_fileManager,(int)auStack_a8,(void *)(long)(int)uVar4,in_RCX);
  return;
}

Assistant:

void CDirectiveAlign::Encode()
{
	unsigned char AlignBuffer[128];
	
	int n = computePadding();
	memset(AlignBuffer,0,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(AlignBuffer,128);
		n -= 128;
	}
	g_fileManager->write(AlignBuffer,n);
}